

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tree.c
# Opt level: O1

ClassStmt * new_class_stmt(Token *name,List *extends,BlockStmt *block,Modifier *modifier)

{
  Token *pTVar1;
  void *pvVar2;
  ClassStmt *pCVar3;
  undefined8 *puVar4;
  
  pvVar2 = malloc(0x28);
  pCVar3 = (ClassStmt *)require_not_null(pvVar2,"Failed to allocate space");
  pvVar2 = malloc(0x10);
  puVar4 = (undefined8 *)require_not_null(pvVar2,"Failed to allocate space");
  puVar4[1] = name;
  *puVar4 = class_eval;
  pTVar1 = (Token *)puVar4[1];
  (pCVar3->node).eval = (eval_handler_)*puVar4;
  (pCVar3->node).token = pTVar1;
  pCVar3->extends = extends;
  pCVar3->block = block;
  pCVar3->modifier = modifier;
  return pCVar3;
}

Assistant:

ClassStmt *new_class_stmt(Token *name, List *extends, BlockStmt *block, Modifier* modifier) {
    ClassStmt *stmt = new(ClassStmt);
    stmt->node = tree_node_(name, eval_handler(class_eval));
    stmt->extends = extends;
    stmt->block = block;
    stmt->modifier = modifier;
    return stmt;
}